

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildWithLogTestRspFileCmdLineChange::Run(BuildWithLogTestRspFileCmdLineChange *this)

{
  State *state;
  VirtualFileSystem *this_00;
  int *piVar1;
  Builder *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  int iVar2;
  Test *pTVar3;
  bool bVar4;
  Node *pNVar5;
  LogEntry *pLVar6;
  int iVar7;
  string err;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80;
  string local_60;
  LogEntry *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  iVar7 = g_current_test->assertion_failures_;
  state = &(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule cat_rsp\n  command = cat $rspfile > $out\n  rspfile = $rspfile\n  rspfile_content = $long_command\nbuild out: cat_rsp in\n  rspfile = out.rsp\n  long_command = Original very long command\n"
              ,(ManifestParserOptions)0x0);
  if (iVar7 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"out",&local_82);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  this_00 = &(this->super_BuildWithLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  piVar1 = &(this->super_BuildWithLogTest).super_BuildTest.fs_.now_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"in",&local_82);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  VirtualFileSystem::Create(this_00,&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  pTVar3 = g_current_test;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"out",&local_82);
  this_01 = &(this->super_BuildWithLogTest).super_BuildTest.builder_;
  pNVar5 = Builder::AddTarget(this_01,&local_80,&local_60);
  testing::Test::Check
            (pTVar3,pNVar5 != (Node *)0x0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc",
             0x7bb,"builder_.AddTarget(\"out\", &err)");
  std::__cxx11::string::~string((string *)&local_80);
  pTVar3 = g_current_test;
  bVar4 = std::operator==("",&local_60);
  bVar4 = testing::Test::Check
                    (pTVar3,bVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                     ,0x7bc,"\"\" == err");
  pTVar3 = g_current_test;
  if (bVar4) {
    bVar4 = Builder::Build(this_01,&local_60);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7bf,"builder_.Build(&err)");
    bVar4 = testing::Test::Check
                      (g_current_test,
                       (long)*(pointer *)
                              ((long)&(this->super_BuildWithLogTest).super_BuildTest.command_runner_
                                      .commands_ran_.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data + 8) -
                       (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                             commands_ran_.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start == 0x20,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x7c0,"1u == command_runner_.commands_ran_.size()");
    if (!bVar4) goto LAB_0012ffd3;
    this_02 = &(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_02);
    State::Reset(state);
    pTVar3 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"out",&local_82);
    pNVar5 = Builder::AddTarget(this_01,&local_80,&local_60);
    testing::Test::Check
              (pTVar3,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7c5,"builder_.AddTarget(\"out\", &err)");
    std::__cxx11::string::~string((string *)&local_80);
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_60);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0x7c6,"\"\" == err");
    pTVar3 = g_current_test;
    bVar4 = Builder::AlreadyUpToDate(this_01);
    bVar4 = testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x7c7,"builder_.AlreadyUpToDate()");
    if (!bVar4) goto LAB_0012ffd3;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"out",&local_82);
    pLVar6 = BuildLog::LookupByOutput(&(this->super_BuildWithLogTest).build_log_,&local_80);
    local_38 = this_02;
    std::__cxx11::string::~string((string *)&local_80);
    local_40 = pLVar6;
    bVar4 = testing::Test::Check
                      (g_current_test,pLVar6 != (LogEntry *)0x0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0x7cc,"__null != log_entry");
    iVar2 = g_current_test->assertion_failures_;
    iVar7 = iVar2;
    if (bVar4) {
      AssertHash("cat out.rsp > out;rspfile=Original very long command",local_40->command_hash);
      iVar7 = g_current_test->assertion_failures_;
      if (iVar2 == iVar7) {
        local_40->command_hash = local_40->command_hash + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(local_38);
        State::Reset(state);
        pTVar3 = g_current_test;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"out",&local_82);
        pNVar5 = Builder::AddTarget(this_01,&local_80,&local_60);
        testing::Test::Check
                  (pTVar3,pNVar5 != (Node *)0x0,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x7d4,"builder_.AddTarget(\"out\", &err)");
        std::__cxx11::string::~string((string *)&local_80);
        pTVar3 = g_current_test;
        bVar4 = std::operator==("",&local_60);
        testing::Test::Check
                  (pTVar3,bVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x7d5,"\"\" == err");
        pTVar3 = g_current_test;
        bVar4 = Builder::Build(this_01,&local_60);
        testing::Test::Check
                  (pTVar3,bVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x7d6,"builder_.Build(&err)");
        testing::Test::Check
                  (g_current_test,
                   (long)*(pointer *)
                          ((long)&(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                                  commands_ran_.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data + 8) -
                   (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                         commands_ran_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start == 0x20,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                   ,0x7d7,"1u == command_runner_.commands_ran_.size()");
        goto LAB_0012ffe2;
      }
    }
  }
  else {
LAB_0012ffd3:
    iVar7 = g_current_test->assertion_failures_;
  }
  g_current_test->assertion_failures_ = iVar7 + 1;
LAB_0012ffe2:
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

TEST_F(BuildWithLogTest, RspFileCmdLineChange) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
    "rule cat_rsp\n"
    "  command = cat $rspfile > $out\n"
    "  rspfile = $rspfile\n"
    "  rspfile_content = $long_command\n"
    "build out: cat_rsp in\n"
    "  rspfile = out.rsp\n"
    "  long_command = Original very long command\n"));

  fs_.Create("out", "");
  fs_.Tick();
  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  ASSERT_EQ("", err);

  // 1. Build for the 1st time (-> populate log)
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());

  // 2. Build again (no change)
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_EQ("", err);
  ASSERT_TRUE(builder_.AlreadyUpToDate());

  // 3. Alter the entry in the logfile
  // (to simulate a change in the command line between 2 builds)
  BuildLog::LogEntry* log_entry = build_log_.LookupByOutput("out");
  ASSERT_TRUE(NULL != log_entry);
  ASSERT_NO_FATAL_FAILURE(AssertHash(
        "cat out.rsp > out;rspfile=Original very long command",
        log_entry->command_hash));
  log_entry->command_hash++;  // Change the command hash to something else.
  // Now expect the target to be rebuilt
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("out", &err));
  EXPECT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ(1u, command_runner_.commands_ran_.size());
}